

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowLeadLagExecutor::EvaluateInternal
          (WindowLeadLagExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  _func_int **pp_Var3;
  BoundWindowExpression *pBVar4;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  type pWVar6;
  WindowLeadLagExecutor *pWVar7;
  WindowExecutor **ppWVar8;
  int iVar9;
  reference pvVar10;
  reference pvVar11;
  pointer this_00;
  idx_t iVar12;
  long lVar13;
  long lVar14;
  unsigned_long uVar15;
  pointer this_01;
  pointer pEVar16;
  ulong uVar17;
  pointer this_02;
  byte bVar18;
  ulong uVar19;
  WindowExecutorLocalState *pWVar20;
  idx_t iVar21;
  unsigned_long width;
  ulong uVar22;
  ulong source_offset;
  byte bVar23;
  pair<unsigned_long,_unsigned_long> pVar24;
  idx_t delta;
  WindowInputExpression leadlag_default;
  WindowInputExpression leadlag_offset;
  idx_t local_c8;
  idx_t local_b8;
  type local_b0;
  ValidityMask **local_a8;
  WindowLeadLagExecutor *local_a0;
  DataChunk *local_98;
  ColumnDataScanState *local_90;
  WindowInputExpression local_88;
  WindowExecutor **local_70;
  data_ptr_t local_68;
  WindowInputExpression local_60;
  ulong local_48;
  data_ptr_t local_40;
  idx_t local_38;
  
  local_b0 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
             operator*(&lstate[0x15].range_cursor);
  WindowInputExpression::WindowInputExpression
            (&local_60,eval_chunk,(this->super_WindowValueExecutor).offset_idx);
  WindowInputExpression::WindowInputExpression
            (&local_88,eval_chunk,(this->super_WindowValueExecutor).default_idx);
  pWVar20 = lstate + 2;
  local_a0 = this;
  if (gstate[2].order_mask == (ValidityMask *)0x0) {
    pvVar10 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar20,0);
    local_40 = pvVar10->data;
    pvVar10 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar20,1);
    pdVar1 = pvVar10->data;
    local_70 = &gstate[2].executor;
    optional_ptr<duckdb::ValidityMask,_true>::CheckValid
              ((optional_ptr<duckdb::ValidityMask,_true> *)local_70);
    pp_Var3 = (gstate[2].executor)->_vptr_WindowExecutor;
    pBVar4 = (this->super_WindowValueExecutor).super_WindowExecutor.wexpr;
    _Var5._M_head_impl =
         (pBVar4->offset_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    bVar23 = pp_Var3 == (_func_int **)0x0 && _Var5._M_head_impl == (Expression *)0x0;
    if (_Var5._M_head_impl != (Expression *)0x0 && pp_Var3 == (_func_int **)0x0) {
      pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pBVar4->offset_expr);
      iVar9 = (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar16);
      bVar23 = (byte)iVar9;
    }
    pBVar4 = (this->super_WindowValueExecutor).super_WindowExecutor.wexpr;
    _Var5._M_head_impl =
         (pBVar4->default_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    bVar18 = _Var5._M_head_impl == (Expression *)0x0 & bVar23;
    local_68 = pdVar1;
    local_a8._0_1_ = bVar18;
    if ((_Var5._M_head_impl != (Expression *)0x0) && (bVar23 != 0)) {
      pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pBVar4->default_expr);
      iVar9 = (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar16);
      local_a8._0_1_ = (byte)iVar9;
    }
    if (count != 0) {
      local_48 = row_idx + count;
      local_90 = &local_b0->state;
      local_98 = &local_b0->chunk;
      local_c8 = 0;
      local_38 = count;
      do {
        pWVar7 = local_a0;
        if ((((local_a0->super_WindowValueExecutor).super_WindowExecutor.wexpr)->offset_expr).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0) {
          lVar13 = 1;
        }
        else {
          pvVar10 = vector<duckdb::Vector,_true>::operator[]
                              (&(local_60.chunk)->data,local_60.col_idx);
          iVar21 = local_c8;
          if (local_60.scalar != false) {
            iVar21 = 0;
          }
          lVar13 = *(long *)(pvVar10->data + iVar21 * 8);
        }
        pWVar6 = local_b0;
        if ((((pWVar7->super_WindowValueExecutor).super_WindowExecutor.wexpr)->super_Expression).
            super_BaseExpression.type == WINDOW_LEAD) {
          iVar21 = AddOperatorOverflowCheck::Operation<long,long,long>(row_idx,lVar13);
        }
        else {
          iVar21 = SubtractOperatorOverflowCheck::Operation<long,long,long>(row_idx,lVar13);
        }
        ppWVar8 = local_70;
        local_b8 = 0;
        if ((long)iVar21 < (long)row_idx) {
          local_b8 = row_idx - iVar21;
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_70);
          iVar21 = WindowBoundariesState::FindPrevStart
                             ((ValidityMask *)*ppWVar8,*(idx_t *)(local_40 + local_c8 * 8),row_idx,
                              &local_b8);
        }
        else if (iVar21 - row_idx != 0 && (long)row_idx <= (long)iVar21) {
          local_b8 = iVar21 - row_idx;
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_70);
          iVar21 = WindowBoundariesState::FindNextStart
                             ((ValidityMask *)*ppWVar8,row_idx + 1,
                              *(idx_t *)(local_68 + local_c8 * 8),&local_b8);
        }
        pdVar1 = local_68;
        if ((byte)local_a8 == 0) {
          if (local_b8 == 0) {
            uVar15 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar21);
            WindowCursor::CopyCell(pWVar6,0,uVar15,result,local_c8);
          }
          else if ((((pWVar7->super_WindowValueExecutor).super_WindowExecutor.wexpr)->default_expr).
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl ==
                   (Expression *)0x0) {
            FlatVector::SetNull(result,local_c8,true);
          }
          else {
            pvVar10 = vector<duckdb::Vector,_true>::operator[]
                                (&(local_88.chunk)->data,local_88.col_idx);
            iVar21 = local_c8;
            if (local_88.scalar != false) {
              iVar21 = 0;
            }
            VectorOperations::Copy(pvVar10,result,iVar21 + 1,iVar21,local_c8);
          }
          local_c8 = local_c8 + 1;
          row_idx = row_idx + 1;
        }
        else {
          uVar17 = *(ulong *)(local_68 + local_c8 * 8);
          if (local_48 <= *(ulong *)(local_68 + local_c8 * 8)) {
            uVar17 = local_48;
          }
          uVar22 = uVar17 - row_idx;
          if (local_b8 == 0) {
            uVar17 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar21);
            pWVar6 = local_b0;
            uVar19 = *(long *)(pdVar1 + local_c8 * 8) - uVar17;
            if (uVar22 <= *(long *)(pdVar1 + local_c8 * 8) - uVar17) {
              uVar19 = uVar22;
            }
            for (; uVar19 != 0; uVar19 = uVar19 - uVar22) {
              if (((pWVar6->state).next_row_index <= uVar17) ||
                 (uVar17 < (pWVar6->state).current_row_index)) {
                this_02 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                          ::operator->(&pWVar6->paged->inputs);
                ColumnDataCollection::Seek(this_02,uVar17,local_90,local_98);
              }
              source_offset = (ulong)(uint)((int)uVar17 - (int)(pWVar6->state).current_row_index);
              pvVar10 = vector<duckdb::Vector,_true>::operator[](&local_98->data,0);
              uVar22 = (pWVar6->chunk).count - source_offset;
              if (uVar19 <= uVar22) {
                uVar22 = uVar19;
              }
              VectorOperations::Copy(pvVar10,result,source_offset + uVar22,source_offset,local_c8);
              local_c8 = local_c8 + uVar22;
              row_idx = row_idx + uVar22;
              uVar17 = uVar17 + uVar22;
            }
          }
          else {
            if (local_b8 < uVar22) {
              uVar22 = local_b8;
            }
            if ((((pWVar7->super_WindowValueExecutor).super_WindowExecutor.wexpr)->default_expr).
                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl ==
                (Expression *)0x0) {
              uVar19 = uVar22;
              if (uVar17 == row_idx) goto LAB_011cbb9f;
              do {
                FlatVector::SetNull(result,local_c8,true);
                local_c8 = local_c8 + 1;
                uVar19 = uVar19 - 1;
              } while (uVar19 != 0);
            }
            else {
              pvVar10 = vector<duckdb::Vector,_true>::operator[]
                                  (&(local_88.chunk)->data,local_88.col_idx);
              iVar21 = local_c8;
              if (local_88.scalar != false) {
                iVar21 = 0;
              }
              VectorOperations::Copy(pvVar10,result,iVar21 + uVar22,iVar21,local_c8);
              local_c8 = local_c8 + uVar22;
            }
            row_idx = row_idx + uVar22;
          }
        }
LAB_011cbb9f:
      } while (local_c8 < local_38);
    }
  }
  else {
    pvVar10 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar20,6);
    pdVar1 = pvVar10->data;
    pvVar10 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar20,7);
    pdVar2 = pvVar10->data;
    pWVar20 = lstate + 0x14;
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::resize
              ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)pWVar20,1);
    local_90 = (ColumnDataScanState *)pWVar20;
    pvVar11 = vector<duckdb::FrameBounds,_true>::operator[]
                        ((vector<duckdb::FrameBounds,_true> *)pWVar20,0);
    if (count != 0) {
      local_98 = (DataChunk *)&gstate[2].order_mask;
      local_a8 = &gstate[2].partition_mask;
      iVar21 = 0;
      do {
        iVar12 = *(idx_t *)(pdVar2 + iVar21 * 8);
        pvVar11->start = *(idx_t *)(pdVar1 + iVar21 * 8);
        pvVar11->end = iVar12;
        this_00 = unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                  ::operator->((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                                *)local_98);
        iVar12 = WindowTokenTree::Rank(this_00,pvVar11->start,pvVar11->end,row_idx + iVar21);
        lVar13 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar12 - 1);
        if ((((local_a0->super_WindowValueExecutor).super_WindowExecutor.wexpr)->offset_expr).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0) {
          lVar14 = 1;
        }
        else {
          pvVar10 = vector<duckdb::Vector,_true>::operator[]
                              (&(local_60.chunk)->data,local_60.col_idx);
          iVar12 = iVar21;
          if (local_60.scalar != false) {
            iVar12 = 0;
          }
          lVar14 = *(long *)(pvVar10->data + iVar12 * 8);
        }
        if ((((local_a0->super_WindowValueExecutor).super_WindowExecutor.wexpr)->super_Expression).
            super_BaseExpression.type == WINDOW_LEAD) {
          lVar13 = AddOperatorOverflowCheck::Operation<long,long,long>(lVar13,lVar14);
        }
        else {
          lVar13 = SubtractOperatorOverflowCheck::Operation<long,long,long>(lVar13,lVar14);
        }
        lVar14 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar11->end - pvVar11->start)
        ;
        if ((lVar13 < 0) || (lVar14 <= lVar13)) {
          if ((((local_a0->super_WindowValueExecutor).super_WindowExecutor.wexpr)->default_expr).
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0)
          goto LAB_011cb797;
          pvVar10 = vector<duckdb::Vector,_true>::operator[]
                              (&(local_88.chunk)->data,local_88.col_idx);
          iVar12 = iVar21;
          if (local_88.scalar != false) {
            iVar12 = 0;
          }
          VectorOperations::Copy(pvVar10,result,iVar12 + 1,iVar12,iVar21);
        }
        else {
          uVar15 = NumericCastImpl<unsigned_long,_long,_false>::Convert(lVar13);
          this_01 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                    ::operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                                  *)local_a8);
          pVar24 = WindowIndexTree::SelectNth(this_01,(SubFrames *)local_90,uVar15);
          if (pVar24.second == 0) {
            WindowCursor::CopyCell(local_b0,0,pVar24.first,result,iVar21);
          }
          else {
LAB_011cb797:
            FlatVector::SetNull(result,iVar21,true);
          }
        }
        iVar21 = iVar21 + 1;
      } while (count != iVar21);
    }
  }
  return;
}

Assistant:

void WindowLeadLagExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                             DataChunk &eval_chunk, Vector &result, idx_t count, idx_t row_idx) const {
	auto &glstate = gstate.Cast<WindowLeadLagGlobalState>();
	auto &llstate = lstate.Cast<WindowLeadLagLocalState>();
	auto &cursor = *llstate.cursor;

	WindowInputExpression leadlag_offset(eval_chunk, offset_idx);
	WindowInputExpression leadlag_default(eval_chunk, default_idx);

	if (glstate.row_tree) {
		auto frame_begin = FlatVector::GetData<const idx_t>(llstate.bounds.data[FRAME_BEGIN]);
		auto frame_end = FlatVector::GetData<const idx_t>(llstate.bounds.data[FRAME_END]);
		// TODO: Handle subframes.
		auto &frames = llstate.frames;
		frames.resize(1);
		auto &frame = frames[0];
		for (idx_t i = 0; i < count; ++i, ++row_idx) {
			// (1) compute the ROW_NUMBER of the own row
			frame = FrameBounds(frame_begin[i], frame_end[i]);
			const auto own_row = glstate.row_tree->Rank(frame.start, frame.end, row_idx) - 1;
			// (2) adjust the row number by adding or subtracting an offset
			auto val_idx = NumericCast<int64_t>(own_row);
			int64_t offset = 1;
			if (wexpr.offset_expr) {
				offset = leadlag_offset.GetCell<int64_t>(i);
			}
			if (wexpr.GetExpressionType() == ExpressionType::WINDOW_LEAD) {
				val_idx = AddOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(val_idx, offset);
			} else {
				val_idx = SubtractOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(val_idx, offset);
			}
			const auto frame_width = NumericCast<int64_t>(frame.end - frame.start);
			if (val_idx >= 0 && val_idx < frame_width) {
				// (3) find the row at that offset
				const auto n = NumericCast<idx_t>(val_idx);
				const auto nth_index = glstate.value_tree->SelectNth(frames, n);
				// (4) evaluate the expression provided to LEAD/LAG on this row.
				if (nth_index.second) {
					//	Overflow
					FlatVector::SetNull(result, i, true);
				} else {
					cursor.CopyCell(0, nth_index.first, result, i);
				}
			} else if (wexpr.default_expr) {
				leadlag_default.CopyCell(result, i);
			} else {
				FlatVector::SetNull(result, i, true);
			}
		}
		return;
	}

	auto partition_begin = FlatVector::GetData<const idx_t>(llstate.bounds.data[PARTITION_BEGIN]);
	auto partition_end = FlatVector::GetData<const idx_t>(llstate.bounds.data[PARTITION_END]);

	auto &ignore_nulls = glstate.ignore_nulls;
	bool can_shift = ignore_nulls->AllValid();
	if (wexpr.offset_expr) {
		can_shift = can_shift && wexpr.offset_expr->IsFoldable();
	}
	if (wexpr.default_expr) {
		can_shift = can_shift && wexpr.default_expr->IsFoldable();
	}

	const auto row_end = row_idx + count;
	for (idx_t i = 0; i < count;) {
		int64_t offset = 1;
		if (wexpr.offset_expr) {
			offset = leadlag_offset.GetCell<int64_t>(i);
		}
		int64_t val_idx = (int64_t)row_idx;
		if (wexpr.GetExpressionType() == ExpressionType::WINDOW_LEAD) {
			val_idx = AddOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(val_idx, offset);
		} else {
			val_idx = SubtractOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(val_idx, offset);
		}

		idx_t delta = 0;
		if (val_idx < (int64_t)row_idx) {
			// Count backwards
			delta = idx_t(row_idx - idx_t(val_idx));
			val_idx = int64_t(WindowBoundariesState::FindPrevStart(*ignore_nulls, partition_begin[i], row_idx, delta));
		} else if (val_idx > (int64_t)row_idx) {
			delta = idx_t(idx_t(val_idx) - row_idx);
			val_idx =
			    int64_t(WindowBoundariesState::FindNextStart(*ignore_nulls, row_idx + 1, partition_end[i], delta));
		}
		// else offset is zero, so don't move.

		if (can_shift) {
			const auto target_limit = MinValue(partition_end[i], row_end) - row_idx;
			if (!delta) {
				//	Copy source[index:index+width] => result[i:]
				auto index = NumericCast<idx_t>(val_idx);
				const auto source_limit = partition_end[i] - index;
				auto width = MinValue(source_limit, target_limit);
				// We may have to scan multiple blocks here, so loop until we have copied everything
				const idx_t col_idx = 0;
				while (width) {
					const auto source_offset = cursor.Seek(index);
					auto &source = cursor.chunk.data[col_idx];
					const auto copied = MinValue<idx_t>(cursor.chunk.size() - source_offset, width);
					VectorOperations::Copy(source, result, source_offset + copied, source_offset, i);
					i += copied;
					row_idx += copied;
					index += copied;
					width -= copied;
				}
			} else if (wexpr.default_expr) {
				const auto width = MinValue(delta, target_limit);
				leadlag_default.CopyCell(result, i, width);
				i += width;
				row_idx += width;
			} else {
				for (idx_t nulls = MinValue(delta, target_limit); nulls--; ++i, ++row_idx) {
					FlatVector::SetNull(result, i, true);
				}
			}
		} else {
			if (!delta) {
				cursor.CopyCell(0, NumericCast<idx_t>(val_idx), result, i);
			} else if (wexpr.default_expr) {
				leadlag_default.CopyCell(result, i);
			} else {
				FlatVector::SetNull(result, i, true);
			}
			++i;
			++row_idx;
		}
	}
}